

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

NTrodeObj * __thiscall TrodesConfig::getNTrodeByID(TrodesConfig *this,string *id)

{
  bool bVar1;
  long in_RSI;
  NTrodeObj *in_RDI;
  NTrodeObj *nt;
  const_iterator __end1;
  const_iterator __begin1;
  vector<NTrodeObj,_std::allocator<NTrodeObj>_> *__range1;
  NTrodeObj *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  NTrodeObj *in_stack_ffffffffffffffa8;
  NTrodeObj *in_stack_ffffffffffffffb0;
  __normal_iterator<const_NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_> local_28
  ;
  long local_20;
  
  local_20 = in_RSI + 0x20;
  local_28._M_current =
       (NTrodeObj *)
       std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::begin(in_stack_ffffffffffffff88);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::end
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       (__normal_iterator<const_NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      NTrodeObj::NTrodeObj(in_stack_ffffffffffffffb0);
      return in_RDI;
    }
    __gnu_cxx::
    __normal_iterator<const_NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>::
    operator*(&local_28);
    NTrodeObj::getId_abi_cxx11_(in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff97 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffffb0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffffa8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    if ((in_stack_ffffffffffffff97 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<const_NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>::
    operator++(&local_28);
  }
  NTrodeObj::NTrodeObj(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return in_RDI;
}

Assistant:

NTrodeObj TrodesConfig::getNTrodeByID(const std::string &id) const{
    for(auto const &nt : nTrodes){
        if(nt.getId() == id){
            return nt;
        }
    }
    return NTrodeObj();
}